

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkSensitivityMiter(Abc_Ntk_t *pNtk,int iVar)

{
  int *piVar1;
  void **ppvVar2;
  void *pvVar3;
  int iVar4;
  Abc_Obj_t *in_RAX;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSense.c"
                  ,0x49,"Abc_Ntk_t *Abc_NtkSensitivityMiter(Abc_Ntk_t *, int)");
  }
  if (pNtk->vCis->nSize <= iVar) {
    __assert_fail("iVar < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSense.c"
                  ,0x4a,"Abc_Ntk_t *Abc_NtkSensitivityMiter(Abc_Ntk_t *, int)");
  }
  local_38 = in_RAX;
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar5 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar5;
  pcVar5 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar5;
  Abc_NtkCleanCopy(pNtk);
  pAVar6 = Abc_AigConst1(pNtk_00);
  pAVar7 = Abc_AigConst1(pNtk);
  (pAVar7->field_6).pCopy = pAVar6;
  pAVar6 = Abc_AigConst1(pNtk_00);
  pAVar7 = Abc_AigConst1(pNtk);
  (pAVar7->field_5).pData = pAVar6;
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
      local_38 = pAVar6;
      pAVar7 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
      (pAVar6->field_6).pCopy = pAVar7;
      (pAVar6->field_5).pData = pAVar7;
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar12 < pVVar8->nSize);
  }
  Abc_NtkAddDummyPiNames(pNtk_00);
  if ((-1 < iVar) && (iVar < pNtk->vCis->nSize)) {
    pAVar6 = (Abc_Obj_t *)pNtk->vCis->pArray[(uint)iVar];
    local_38 = pAVar6;
    pAVar7 = Abc_AigConst1(pNtk_00);
    (pAVar6->field_6).pTemp = (void *)((ulong)pAVar7 ^ 1);
    pAVar7 = Abc_AigConst1(pNtk_00);
    (pAVar6->field_5).pData = pAVar7;
    pVVar8 = Abc_NtkDfsReverseNodes(pNtk,&local_38,1);
    iVar4 = pVVar8->nSize;
    if (0 < iVar4) {
      lVar12 = 0;
      do {
        local_38 = (Abc_Obj_t *)pVVar8->pArray[lVar12];
        if (local_38 != (Abc_Obj_t *)0x0) {
          do {
            pAVar6 = (local_38->field_6).pCopy;
            pAVar7 = (Abc_Obj_t *)local_38->pNtk->vObjs->pArray[*(local_38->vFanins).pArray];
            iVar4 = Abc_NodeIsTravIdCurrent(pAVar7);
            if (iVar4 == 0) {
              pAVar9 = Abc_NtkSensitivityMiter_rec(pNtk_00,pAVar7);
              (pAVar7->field_5).pData = pAVar9;
            }
            pAVar7 = (Abc_Obj_t *)local_38->pNtk->vObjs->pArray[(local_38->vFanins).pArray[1]];
            iVar4 = Abc_NodeIsTravIdCurrent(pAVar7);
            if (iVar4 == 0) {
              pAVar9 = Abc_NtkSensitivityMiter_rec(pNtk_00,pAVar7);
              (pAVar7->field_5).pData = pAVar9;
            }
            piVar1 = (local_38->vFanins).pArray;
            ppvVar2 = local_38->pNtk->vObjs->pArray;
            pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                                (Abc_Obj_t *)
                                ((ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1) ^
                                *(ulong *)((long)ppvVar2[*piVar1] + 0x40)),
                                (Abc_Obj_t *)
                                ((ulong)(*(uint *)&local_38->field_0x14 >> 0xb & 1) ^
                                *(ulong *)((long)ppvVar2[piVar1[1]] + 0x40)));
            (local_38->field_6).pCopy = pAVar7;
            piVar1 = (local_38->vFanins).pArray;
            ppvVar2 = local_38->pNtk->vObjs->pArray;
            pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                                (Abc_Obj_t *)
                                ((ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1) ^
                                *(ulong *)((long)ppvVar2[*piVar1] + 0x38)),
                                (Abc_Obj_t *)
                                ((ulong)(*(uint *)&local_38->field_0x14 >> 0xb & 1) ^
                                *(ulong *)((long)ppvVar2[piVar1[1]] + 0x38)));
            (local_38->field_5).pData = pAVar7;
            local_38 = pAVar6;
          } while (pAVar6 != (Abc_Obj_t *)0x0);
          iVar4 = pVVar8->nSize;
          local_38 = (Abc_Obj_t *)0x0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar4);
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
    pAVar6 = Abc_AigConst1(pNtk_00);
    pAVar6 = (Abc_Obj_t *)((ulong)pAVar6 ^ 1);
    pVVar8 = pNtk->vCos;
    if (0 < pVVar8->nSize) {
      uVar11 = 0;
      do {
        local_38 = (Abc_Obj_t *)pVVar8->pArray[uVar11];
        iVar4 = Abc_NodeIsTravIdCurrent(local_38);
        if (iVar4 != 0) {
          uVar10 = (ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1);
          pvVar3 = local_38->pNtk->vObjs->pArray[*(local_38->vFanins).pArray];
          if (uVar11 == pNtk->vCos->nSize - 1) {
            pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar6,
                                (Abc_Obj_t *)(uVar10 ^ *(ulong *)((long)pvVar3 + 0x38)));
            pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar6,
                                (Abc_Obj_t *)
                                ((ulong)(*(uint *)&local_38->field_0x14 >> 10 & 1) ^
                                *(ulong *)((long)local_38->pNtk->vObjs->pArray
                                                 [*(local_38->vFanins).pArray] + 0x40)));
          }
          else {
            pAVar7 = Abc_AigXor((Abc_Aig_t *)pNtk_00->pManFunc,
                                (Abc_Obj_t *)(*(ulong *)((long)pvVar3 + 0x40) ^ uVar10),
                                (Abc_Obj_t *)(uVar10 ^ *(ulong *)((long)pvVar3 + 0x38)));
            pAVar6 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar6,pAVar7);
          }
        }
        uVar11 = uVar11 + 1;
        pVVar8 = pNtk->vCos;
      } while ((long)uVar11 < (long)pVVar8->nSize);
    }
    pAVar7 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
    Abc_ObjAddFanin(pAVar7,pAVar6);
    Abc_ObjAssignName(pAVar7,"miter",(char *)0x0);
    iVar4 = Abc_NtkCheck(pNtk_00);
    if (iVar4 == 0) {
      puts("Abc_NtkSensitivityMiter: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    return pNtk_00;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSensitivityMiter( Abc_Ntk_t * pNtk, int iVar )
{
    Abc_Ntk_t * pMiter;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext, * pFanin, * pOutput, * pObjNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( iVar < Abc_NtkCiNum(pNtk) );

    // duplicate the network
    pMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pMiter->pName = Extra_UtilStrsav(pNtk->pName);
    pMiter->pSpec = Extra_UtilStrsav(pNtk->pSpec);

    // assign the PIs
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pMiter);
    Abc_AigConst1(pNtk)->pData = Abc_AigConst1(pMiter);
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi( pMiter );
        pObj->pData = pObj->pCopy;
    }
    Abc_NtkAddDummyPiNames( pMiter );

    // assign the cofactors of the CI node to be constants
    pObj = Abc_NtkCi( pNtk, iVar );
    pObj->pCopy = Abc_ObjNot( Abc_AigConst1(pMiter) ); 
    pObj->pData = Abc_AigConst1(pMiter); 

    // collect the internal nodes
    vNodes = Abc_NtkDfsReverseNodes( pNtk, &pObj, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        for ( pNext = pObj? pObj->pCopy : pObj; pObj; pObj = pNext, pNext = pObj? pObj->pCopy : pObj )
        {
            pFanin = Abc_ObjFanin0(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                pFanin->pData = Abc_NtkSensitivityMiter_rec( pMiter, pFanin );
            pFanin = Abc_ObjFanin1(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                pFanin->pData = Abc_NtkSensitivityMiter_rec( pMiter, pFanin );
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Data(pObj), Abc_ObjChild1Data(pObj) );
        }
    }
    Vec_PtrFree( vNodes );

    // update the affected COs
    pOutput = Abc_ObjNot( Abc_AigConst1(pMiter) ); 
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        // get the result of quantification
        if ( i == Abc_NtkCoNum(pNtk) - 1 )
        {
            pOutput = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, pOutput, Abc_ObjChild0Data(pObj) );
            pOutput = Abc_AigAnd( (Abc_Aig_t *)pMiter->pManFunc, pOutput, Abc_ObjChild0Copy(pObj) );
        }
        else
        {
            pNext   = Abc_AigXor( (Abc_Aig_t *)pMiter->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
            pOutput = Abc_AigOr( (Abc_Aig_t *)pMiter->pManFunc, pOutput, pNext );
        }
    }
    // add the PO node and name
    pObjNew = Abc_NtkCreatePo(pMiter);
    Abc_ObjAddFanin( pObjNew, pOutput );
    Abc_ObjAssignName( pObjNew, "miter", NULL );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pMiter ) )
    {
        printf( "Abc_NtkSensitivityMiter: The network check has failed.\n" );
        Abc_NtkDelete( pMiter );
        return NULL;
    }
    return pMiter;
}